

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCLocaleEnvironmentScope.cxx
# Opt level: O2

void __thiscall
cmCLocaleEnvironmentScope::cmCLocaleEnvironmentScope(cmCLocaleEnvironmentScope *this)

{
  _Rb_tree_header *p_Var1;
  char *this_00;
  string lcAll;
  allocator local_72;
  allocator local_71;
  string local_70;
  string local_50;
  string local_30;
  
  p_Var1 = &(this->EnvironmentBackup)._M_t._M_impl.super__Rb_tree_header;
  (this->EnvironmentBackup)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->EnvironmentBackup)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->EnvironmentBackup)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->EnvironmentBackup)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->EnvironmentBackup)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::__cxx11::string::string((string *)&local_50,"LANGUAGE",(allocator *)&local_30);
  std::__cxx11::string::string((string *)&local_70,"",&local_72);
  SetEnv(this,&local_50,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string((string *)&local_50,"LC_MESSAGES",(allocator *)&local_30);
  std::__cxx11::string::string((string *)&local_70,"C",&local_72);
  SetEnv(this,&local_50,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  this_00 = "LC_ALL";
  std::__cxx11::string::string((string *)&local_70,"LC_ALL",(allocator *)&local_30);
  GetEnv(&local_50,(cmCLocaleEnvironmentScope *)this_00,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  if (local_50._M_string_length != 0) {
    std::__cxx11::string::string((string *)&local_70,"LC_ALL",&local_72);
    std::__cxx11::string::string((string *)&local_30,"",&local_71);
    SetEnv(this,&local_70,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::string((string *)&local_70,"LC_CTYPE",(allocator *)&local_30);
    SetEnv(this,&local_70,&local_50);
    std::__cxx11::string::~string((string *)&local_70);
  }
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

cmCLocaleEnvironmentScope::cmCLocaleEnvironmentScope()
{
  this->SetEnv("LANGUAGE", "");
  this->SetEnv("LC_MESSAGES", "C");

  std::string lcAll = this->GetEnv("LC_ALL");

  if(!lcAll.empty())
    {
    this->SetEnv("LC_ALL", "");
    this->SetEnv("LC_CTYPE", lcAll);
    }
}